

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplesort.hpp
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
mxx::impl::
sample_arbit_decomp<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,impl *this,long begin,
          size_type_conflict end,comm *param_5)

{
  impl *piVar1;
  int iVar2;
  void *pvVar3;
  vector<int,_std::allocator<int>_> *__return_storage_ptr___00;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_sizes;
  value_type my_splitter;
  size_t local_size;
  vector<int,_std::allocator<int>_> local_splitters;
  vector<int,_std::allocator<int>_> *result_splitters;
  allocator_type local_b9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b8;
  int local_9c;
  ulong local_98;
  ulong local_90;
  custom_op<unsigned_long> local_88;
  vector<int,_std::allocator<int>_> *local_40;
  value_type_conflict2 local_38;
  
  local_90 = begin - (long)this >> 2;
  local_40 = __return_storage_ptr__;
  custom_op<unsigned_long>::custom_op<std::plus<unsigned_long>>(&local_88,1);
  MPI_Allreduce(&local_90,&local_b8,1,local_88.m_type_copy,local_88.m_op,param_5->mpi_comm);
  uVar6 = CONCAT44(local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start._4_4_,
                   (uint)local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start);
  custom_op<unsigned_long>::~custom_op(&local_88);
  iVar2 = param_5->m_size;
  if (local_90 == 0) {
    local_98 = 0;
  }
  else {
    uVar4 = ((long)iVar2 * end * local_90 + uVar6) - 1;
    local_98 = 1;
    if (uVar6 <= uVar4) {
      local_98 = uVar4 / uVar6;
    }
  }
  custom_op<unsigned_long>::custom_op<std::plus<unsigned_long>>(&local_88,1);
  MPI_Allreduce(&local_98,&local_b8,1,local_88.m_type_copy,local_88.m_op,param_5->mpi_comm);
  uVar6 = CONCAT44(local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start._4_4_,
                   (uint)local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start);
  custom_op<unsigned_long>::~custom_op(&local_88);
  if (uVar6 < (long)iVar2 * end) {
    MPI_Comm_rank(&ompi_mpi_comm_world,&local_88);
    printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",
           (ulong)local_88._vptr_custom_op & 0xffffffff,
           "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/samplesort.hpp"
           ,0x71,"sample_arbit_decomp","mxx::allreduce(local_s, comm) >= p*s");
    fflush(_stdout);
    MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
  }
  __return_storage_ptr___00 = local_40;
  local_88._vptr_custom_op = (_func_int **)0x0;
  local_88.m_user_func.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_88.m_user_func.super__Function_base._M_functor._8_8_ = 0;
  if (local_98 != 0) {
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)&local_88,local_98);
    if ((long)local_88.m_user_func.super__Function_base._M_functor._M_unused._0_8_ -
        (long)local_88._vptr_custom_op != 0) {
      lVar5 = (long)local_88.m_user_func.super__Function_base._M_functor._M_unused._0_8_ -
              (long)local_88._vptr_custom_op >> 2;
      uVar6 = 0;
      do {
        piVar1 = this + ((local_90 / (local_98 + 1) - 1) +
                        (ulong)(uVar6 < local_90 % (local_98 + 1))) * 4;
        this = piVar1 + 4;
        *(undefined4 *)((long)local_88._vptr_custom_op + uVar6 * 4) = *(undefined4 *)piVar1;
        uVar6 = uVar6 + 1;
      } while (lVar5 + (ulong)(lVar5 == 0) != uVar6);
    }
  }
  distribute_container<std::vector<int,_std::allocator<int>_>_>::distribute_inplace
            ((vector<int,_std::allocator<int>_> *)&local_88,param_5);
  uVar6 = (long)local_88.m_user_func.super__Function_base._M_functor._M_unused._0_8_ -
          (long)local_88._vptr_custom_op >> 2;
  if (uVar6 != end) {
    if (uVar6 <= end) {
      MPI_Comm_rank(&ompi_mpi_comm_world,&local_b8);
      printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",
             (ulong)(uint)local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start,
             "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/samplesort.hpp"
             ,0x89,"sample_arbit_decomp","local_splitters.size() > s");
      fflush(_stdout);
      MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
    }
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)&local_88,end);
  }
  bitonic_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
            (local_88._vptr_custom_op,
             local_88.m_user_func.super__Function_base._M_functor._M_unused._M_object,param_5);
  local_9c = *(int *)(local_88.m_user_func.super__Function_base._M_functor._M_unused.
                      _M_function_pointer + -4);
  local_38 = 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_b8,(long)param_5->m_size,&local_38,&local_b9);
  local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish[-1] = 0;
  allgatherv<int>(__return_storage_ptr___00,&local_9c,(ulong)(param_5->m_rank + 1 < param_5->m_size)
                  ,&local_b8,param_5);
  pvVar3 = (void *)CONCAT44(local_b8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start._4_4_,
                            (uint)local_b8.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_b8.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar3);
  }
  if (local_88._vptr_custom_op != (_func_int **)0x0) {
    operator_delete(local_88._vptr_custom_op,
                    local_88.m_user_func.super__Function_base._M_functor._8_8_ -
                    (long)local_88._vptr_custom_op);
  }
  return __return_storage_ptr___00;
}

Assistant:

std::vector<typename std::iterator_traits<_Iterator>::value_type>
sample_arbit_decomp(_Iterator begin, _Iterator end, _Compare comp, size_t s, const mxx::comm& comm) {
    typedef typename std::iterator_traits<_Iterator>::value_type value_type;
    size_t local_size = std::distance(begin, end);

    // get total size n
    size_t total_size = mxx::allreduce(local_size, comm);

    // p = number of processes
    int p = comm.size();

    //  pick a total of s*p samples, thus locally pick ceil((local_size/n)*s*p)
    //  and at least one samples from each processor.
    //  this will result in at least s*p samples.
    size_t local_s;
    if (local_size == 0)
        local_s = 0;
    else
        local_s = std::max<size_t>(((local_size*s*p)+total_size-1)/total_size, 1);

    MXX_ASSERT(mxx::allreduce(local_s, comm) >= p*s);

    // init samples
    std::vector<value_type> local_splitters;

    // pick local samples
    if (local_s > 0) {
        local_splitters.resize(local_s);
        _Iterator pos = begin;
        for (size_t i = 0; i < local_splitters.size(); ++i)
        {
            size_t bucket_size = local_size / (local_s+1) + (i < (local_size % (local_s+1)) ? 1 : 0);
            // pick last element of each bucket
            pos += (bucket_size-1);
            local_splitters[i] = *pos;
            ++pos;
        }
    }

    // distribute elements equally
    mxx::distribute_inplace(local_splitters, comm);

    // discard extra splitters, to make it even
    if (local_splitters.size() != s) {
        MXX_ASSERT(local_splitters.size() > s);
        local_splitters.resize(s);
    }

    // sort splitters using parallel bitonic sort
    bitonic_sort(local_splitters.begin(), local_splitters.end(), comp, comm);

    // select the last element on each process but the last
    value_type my_splitter = local_splitters.back();
    // allgather splitters (from all but the last processor)
    std::vector<size_t> recv_sizes(comm.size(), 1);
    recv_sizes.back() = 0;
    std::vector<value_type> result_splitters = mxx::allgatherv(&my_splitter, (comm.rank() + 1 < comm.size()) ? 1 : 0, recv_sizes, comm);

    // return resulting splitters
    return result_splitters;
}